

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

uint16_t object_pack_total(player *p,object *obj,_Bool ignore_inscrip,object **first)

{
  long *plVar1;
  object *obj2;
  _Bool _Var2;
  char cVar3;
  long lVar4;
  char cVar5;
  object **ppoVar6;
  uint16_t uVar7;
  
  if (first != (object **)0x0) {
    *first = (object *)0x0;
  }
  ppoVar6 = &p->gear;
  cVar5 = '\0';
  uVar7 = 0;
  do {
    obj2 = *ppoVar6;
    if (obj2 == (object *)0x0) {
      return uVar7;
    }
    if (obj2 == obj) {
      lVar4 = 0;
      do {
        if ((ulong)(p->body).count * 0x20 + 0x20 == lVar4 + 0x20) goto LAB_0018c7fd;
        plVar1 = (long *)((long)&((p->body).slots)->obj + lVar4);
        lVar4 = lVar4 + 0x20;
      } while ((object *)*plVar1 != obj);
    }
    else {
      if (ignore_inscrip) {
        _Var2 = object_similar(obj,obj2,OSTACK_PACK);
      }
      else {
        _Var2 = object_stackable(obj,obj2,OSTACK_PACK);
      }
      if (_Var2 != false) {
LAB_0018c7fd:
        uVar7 = uVar7 + obj2->number;
        if (first != (object **)0x0) {
          cVar3 = gear_to_label(p,obj2);
          if (*first == (object *)0x0) {
LAB_0018c872:
            *first = obj2;
            cVar5 = cVar3;
          }
          else if ((byte)(cVar3 + 0x9fU) < 0x1a) {
            if ((cVar5 == '\0') || ((byte)(cVar5 + 0x9fU) < 0x1a && cVar3 < cVar5))
            goto LAB_0018c872;
          }
          else if (((byte)(cVar3 - 0x30U) < 10) &&
                  (((byte)(cVar5 + 0x9fU) < 0x1a || cVar5 == '\0' ||
                   (cVar3 < cVar5 && (byte)(cVar5 - 0x30U) < 10)))) goto LAB_0018c872;
        }
      }
    }
    ppoVar6 = &obj2->next;
  } while( true );
}

Assistant:

uint16_t object_pack_total(struct player *p, const struct object *obj,
		bool ignore_inscrip, struct object **first)
{
	uint16_t total = 0;
	char first_label = '\0';
	struct object *cursor;

	if (first) {
		*first = NULL;
	}
	for (cursor = p->gear; cursor; cursor = cursor->next) {
		bool like;

		if (cursor == obj) {
			/*
			 * object_similar() excludes cursor == obj so if
			 * obj is not equipped, account for it here.
			 */
			like = !object_is_equipped(p->body, obj);
		} else if (ignore_inscrip) {
			like = object_similar(obj, cursor, OSTACK_PACK);
		} else {
			like = object_stackable(obj, cursor, OSTACK_PACK);
		}
		if (like) {
			total += cursor->number;
			if (first) {
				char test_label = gear_to_label(p, cursor);

				if (!*first) {
					*first = cursor;
					first_label = test_label;
				} else {
					if (test_label >= 'a'
							&& test_label <= 'z') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					} else if (test_label >= '0'
							&& test_label <= '9') {
						if (first_label == '\0'
								|| (first_label >= 'a'
								&& first_label <= 'z')
								|| (first_label >= '0'
								&& first_label <= '9'
								&& test_label < first_label)) {
							*first = cursor;
							first_label = test_label;
						}
					}
				}
			}
		}
	}

	return total;
}